

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SuperNewDefaultedArgsExpressionSyntax *pSVar1;
  Token *unaff_retaddr;
  NameSyntax *in_stack_00000008;
  BumpAllocator *in_stack_00000010;
  BumpAllocator *in_stack_000000f8;
  Token *in_stack_00000100;
  BumpAllocator *in_stack_ffffffffffffffa8;
  Token *args_3;
  
  args_3 = (Token *)__child_stack;
  not_null<slang::syntax::NameSyntax_*>::operator*
            ((not_null<slang::syntax::NameSyntax_*> *)0x7a64f6);
  deepClone<slang::syntax::NameSyntax>((NameSyntax *)__child_stack,in_stack_ffffffffffffffa8);
  parsing::Token::deepClone(in_stack_00000100,in_stack_000000f8);
  parsing::Token::deepClone(in_stack_00000100,in_stack_000000f8);
  parsing::Token::deepClone(in_stack_00000100,in_stack_000000f8);
  pSVar1 = BumpAllocator::
           emplace<slang::syntax::SuperNewDefaultedArgsExpressionSyntax,slang::syntax::NameSyntax&,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token>
                     (in_stack_00000010,in_stack_00000008,unaff_retaddr,(Token *)__fn,args_3);
  return (int)pSVar1;
}

Assistant:

static SyntaxNode* clone(const SuperNewDefaultedArgsExpressionSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<SuperNewDefaultedArgsExpressionSyntax>(
        *deepClone<NameSyntax>(*node.scopedNew, alloc),
        node.openParen.deepClone(alloc),
        node.defaultKeyword.deepClone(alloc),
        node.closeParen.deepClone(alloc)
    );
}